

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::SummaryTest_construction_with_dynamic_quantile_vector_Test::TestBody
          (SummaryTest_construction_with_dynamic_quantile_vector_Test *this)

{
  initializer_list<prometheus::detail::CKMSQuantiles::Quantile> __l;
  int local_12c;
  duration<long,_std::ratio<1L,_1L>_> local_128;
  milliseconds local_120;
  undefined1 local_118 [8];
  Summary summary;
  allocator<prometheus::detail::CKMSQuantiles::Quantile> local_59;
  Quantile local_58;
  Quantile *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  Quantiles quantiles;
  SummaryTest_construction_with_dynamic_quantile_vector_Test *this_local;
  
  quantiles.
  super__Vector_base<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  detail::CKMSQuantiles::Quantile::Quantile(&local_58,0.99,0.001);
  local_30 = 1;
  local_38 = &local_58;
  std::allocator<prometheus::detail::CKMSQuantiles::Quantile>::allocator(&local_59);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector((vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
            *)local_28,__l,&local_59);
  std::allocator<prometheus::detail::CKMSQuantiles::Quantile>::~allocator(&local_59);
  detail::CKMSQuantiles::Quantile::Quantile
            ((Quantile *)&summary.quantile_values_.rotation_interval_,0.5,0.05);
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::push_back((vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
               *)local_28,(value_type *)&summary.quantile_values_.rotation_interval_);
  local_12c = 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_128,&local_12c);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_120,&local_128);
  Summary::Summary((Summary *)local_118,(Quantiles *)local_28,local_120,2);
  Summary::Observe((Summary *)local_118,8.0);
  Summary::~Summary((Summary *)local_118);
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::~vector((vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
             *)local_28);
  return;
}

Assistant:

TEST(SummaryTest, construction_with_dynamic_quantile_vector) {
  auto quantiles = Summary::Quantiles{{0.99, 0.001}};
  quantiles.push_back({0.5, 0.05});

  Summary summary{quantiles, std::chrono::seconds(1), 2};
  summary.Observe(8.0);
}